

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,ValueType *keyword,ValueType *error)

{
  undefined8 uVar1;
  CrtAllocator *pCVar2;
  ValueType errors;
  MemberIterator member;
  Data local_48;
  undefined8 local_38;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::FindMember<rapidjson::CrtAllocator>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             &stack0xffffffffffffffc8,&this->error_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48.s);
  uVar1 = local_38;
  if ((Number)local_38 == local_48.n.i64) {
    pCVar2 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&this->error_,keyword,error,pCVar2);
  }
  else {
    if (*(short *)(local_38 + 0x1e) == 3) {
      local_48.n.i64 = (Number)0x0;
      local_48.s.str = (Ch *)0x4000000000000;
      pCVar2 = GetStateAllocator(this);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48.s,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(uVar1 + 0x10),
                 pCVar2);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_38 + 0x10),
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48.s);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48.s);
    }
    pCVar2 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_38 + 0x10),
               error,pCVar2);
  }
  return;
}

Assistant:

void AddError(ValueType& keyword, ValueType& error) {
        typename ValueType::MemberIterator member = error_.FindMember(keyword);
        if (member == error_.MemberEnd())
            error_.AddMember(keyword, error, GetStateAllocator());
        else {
            if (member->value.IsObject()) {
                ValueType errors(kArrayType);
                errors.PushBack(member->value, GetStateAllocator());
                member->value = errors;
            }
            member->value.PushBack(error, GetStateAllocator());
        }
    }